

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O1

void process_player_cleanup(void)

{
  byte *pbVar1;
  bitflag *flags;
  loc grid;
  loc grid_00;
  player *ppVar2;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  monster *pmVar6;
  monster_conflict *mon;
  
  ppVar2 = player;
  wVar4 = player->upkeep->energy_use;
  if (wVar4 == L'\0') {
    if (1 < player->skip_cmd_coercion) {
      player->skip_cmd_coercion = '\x01';
    }
  }
  else {
    player->energy = player->energy - (short)wVar4;
    ppVar2->total_energy = ppVar2->total_energy + wVar4;
    if (ppVar2->skip_cmd_coercion != '\0') {
      ppVar2->skip_cmd_coercion = ppVar2->skip_cmd_coercion + 0xff;
    }
    player_take_terrain_damage(ppVar2,ppVar2->grid);
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
    _Var3 = square_isfall(cave,grid);
    if (_Var3) {
      player_fall_off_cliff(player);
      return;
    }
    if (player->upkeep->dropping == false) {
      if (player->timed[6] != 0) {
        pbVar1 = (byte *)((long)&player->upkeep->redraw + 2);
        *pbVar1 = *pbVar1 | 1;
      }
      wVar4 = cave_monster_max(cave);
      if (L'\x01' < wVar4) {
        wVar4 = L'\x01';
        do {
          pmVar6 = cave_monster(cave,wVar4);
          if (pmVar6->race != (monster_race *)0x0) {
            _Var3 = flag_has_dbg(pmVar6->race->flags,0xc,10,"mon->race->flags","RF_ATTR_MULTI");
            if (_Var3) {
              grid_00.x = (pmVar6->grid).x;
              grid_00.y = (pmVar6->grid).y;
              square_light_spot((chunk *)cave,grid_00);
            }
          }
          wVar4 = wVar4 + L'\x01';
          wVar5 = cave_monster_max(cave);
        } while (wVar4 < wVar5);
      }
      wVar4 = cave_monster_max(cave);
      if (L'\x01' < wVar4) {
        wVar4 = L'\x01';
        do {
          mon = (monster_conflict *)cave_monster(cave,wVar4);
          flags = mon->mflag;
          flag_off(flags,2,3);
          _Var3 = flag_has_dbg(flags,2,5,"mon->mflag","MFLAG_MARK");
          if (_Var3) {
            _Var3 = flag_has_dbg(flags,2,4,"mon->mflag","MFLAG_SHOW");
            if (!_Var3) {
              flag_off(flags,2,5);
              update_mon(mon,(chunk *)cave,false);
            }
          }
          wVar4 = wVar4 + L'\x01';
          wVar5 = cave_monster_max(cave);
        } while (wVar4 < wVar5);
      }
    }
  }
  wVar4 = cave_monster_max(cave);
  if (L'\x01' < wVar4) {
    wVar4 = L'\x01';
    do {
      pmVar6 = cave_monster(cave,wVar4);
      flag_off(pmVar6->mflag,2,4);
      wVar4 = wVar4 + L'\x01';
      wVar5 = cave_monster_max(cave);
    } while (wVar4 < wVar5);
  }
  ppVar2 = player;
  player->upkeep->dropping = false;
  update_stuff(ppVar2);
  redraw_stuff(player);
  return;
}

Assistant:

static void process_player_cleanup(void)
{
	int i;

	/* Significant */
	if (player->upkeep->energy_use) {
		/* Use some energy */
		player->energy -= player->upkeep->energy_use;

		/* Increment the total energy counter */
		player->total_energy += player->upkeep->energy_use;

		/*
		 * Since the player used energy, the command wasn't
		 * canceled.  Therefore allow the bloodlust check on
		 * the player's next command unless this was a background
		 * command and the last player-issued command passed the
		 * bloodlust check but was canceled (skip_cmd_coercion is two
		 * in that case).
		 */
		if (player->skip_cmd_coercion) {
			--player->skip_cmd_coercion;
		}

		/* Player can be damaged by terrain */
		player_take_terrain_damage(player, player->grid);

		/* Player can be moved by terrain (or lack of it) */
		if (square_isfall(cave, player->grid)) {
			player_fall_off_cliff(player);
			return;
		}

		/* Do nothing else if player has auto-dropped stuff */
		if (!player->upkeep->dropping) {
			/* Hack -- constant hallucination */
			if (player->timed[TMD_IMAGE])
				player->upkeep->redraw |= (PR_MAP);

			/* Shimmer multi-hued monsters */
			for (i = 1; i < cave_monster_max(cave); i++) {
				struct monster *mon = cave_monster(cave, i);
				if (!mon->race)
					continue;
				if (!rf_has(mon->race->flags, RF_ATTR_MULTI))
					continue;
				square_light_spot(cave, mon->grid);
			}

			/* Clear NICE flag, and show marked monsters */
			for (i = 1; i < cave_monster_max(cave); i++) {
				struct monster *mon = cave_monster(cave, i);
				mflag_off(mon->mflag, MFLAG_NICE);
				if (mflag_has(mon->mflag, MFLAG_MARK)) {
					if (!mflag_has(mon->mflag, MFLAG_SHOW)) {
						mflag_off(mon->mflag, MFLAG_MARK);
						update_mon(mon, cave, false);
					}
				}
			}
		}
	} else if (player->skip_cmd_coercion > 1) {
		/*
		 * The last command was a backround command executing while
		 * skipping the bloodlust check on the player's next command.
		 * Set skip_cmd_coercion back to one in preparation for the
		 * player's next turn.
		 */
		player->skip_cmd_coercion = 1;
	}

	/* Clear SHOW flag and player drop status */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);
		mflag_off(mon->mflag, MFLAG_SHOW);
	}
	player->upkeep->dropping = false;

	/* Hack - update needed first because inventory may have changed */
	update_stuff(player);
	redraw_stuff(player);
}